

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.cc
# Opt level: O3

void DES_encrypt1(uint *data,DES_key_schedule *ks,int enc)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  _union_772 *p_Var5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar3 = (data[1] >> 4 ^ *data) & 0xf0f0f0f;
  uVar1 = *data ^ uVar3;
  uVar4 = uVar3 << 4 ^ data[1];
  uVar3 = uVar4 & 0xffff ^ uVar1 >> 0x10;
  uVar4 = uVar4 ^ uVar3;
  uVar1 = uVar3 << 0x10 ^ uVar1;
  uVar3 = (uVar4 >> 2 ^ uVar1) & 0x33333333;
  uVar1 = uVar1 ^ uVar3;
  uVar4 = uVar3 << 2 ^ uVar4;
  uVar3 = (uVar1 >> 8 ^ uVar4) & 0xff00ff;
  uVar4 = uVar4 ^ uVar3;
  uVar1 = uVar3 << 8 ^ uVar1;
  uVar3 = (uVar4 >> 1 ^ uVar1) & 0x55555555;
  uVar1 = uVar1 ^ uVar3;
  uVar1 = uVar1 << 3 | uVar1 >> 0x1d;
  uVar4 = uVar3 * 2 ^ uVar4;
  uVar3 = uVar4 << 3 | uVar4 >> 0x1d;
  if (enc == 0) {
    uVar7 = *(uint *)((long)ks->ks + 0x7c) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar8 = ks->ks[0xf].deslong[0] ^ uVar1;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[0xe].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x74) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[0xd].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x6c) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[0xc].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 100) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[0xb].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x5c) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[10].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x54) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[9].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x4c) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[8].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x44) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[7].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x3c) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[6].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x34) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[5].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x2c) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[4].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x24) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[3].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x1c) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[2].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x14) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[1].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0xc) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    lVar2 = 4;
    p_Var5 = ks->ks;
  }
  else {
    uVar7 = ks->ks[0].deslong[1] ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar8 = ks->ks[0].deslong[0] ^ uVar1;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[1].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0xc) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[2].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x14) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[3].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x1c) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[4].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x24) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[5].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x2c) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[6].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x34) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[7].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x3c) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[8].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x44) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[9].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x4c) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[10].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x54) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[0xb].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x5c) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[0xc].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 100) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    uVar8 = ks->ks[0xd].deslong[0] ^ uVar3;
    uVar7 = *(uint *)((long)ks->ks + 0x6c) ^ uVar3;
    uVar4 = uVar7 >> 4;
    uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
    uVar8 = ks->ks[0xe].deslong[0] ^ uVar1;
    uVar7 = *(uint *)((long)ks->ks + 0x74) ^ uVar1;
    uVar4 = uVar7 >> 4;
    uVar3 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar8 >> 8 & 0xfc)) ^
            *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar8 >> 0x10 & 0xfc)) ^
            DES_SPtrans[6][uVar8 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc))
            ^ *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
            *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
            DES_SPtrans[7][(uVar7 << 0x1c | uVar4) >> 0x1a] ^ uVar3;
    lVar2 = 0x7c;
    p_Var5 = ks->ks + 0xf;
  }
  uVar6 = p_Var5->deslong[0] ^ uVar3;
  uVar8 = *(uint *)((long)ks->ks + lVar2) ^ uVar3;
  uVar4 = uVar8 >> 4;
  uVar7 = uVar3 << 0x1d | uVar3 >> 3;
  uVar1 = *(uint *)((long)DES_SPtrans[0] + (ulong)(uVar6 & 0xfc)) ^
          *(uint *)((long)DES_SPtrans[2] + (ulong)(uVar6 >> 8 & 0xfc)) ^
          *(uint *)((long)DES_SPtrans[4] + (ulong)(uVar6 >> 0x10 & 0xfc)) ^
          DES_SPtrans[6][uVar6 >> 0x1a] ^ *(uint *)((long)DES_SPtrans[1] + (ulong)(uVar4 & 0xfc)) ^
          *(uint *)((long)DES_SPtrans[3] + (ulong)((uVar4 & 0xfc00) >> 8)) ^
          *(uint *)((long)DES_SPtrans[5] + (ulong)((uVar4 & 0xfc0000) >> 0x10)) ^
          DES_SPtrans[7][(uVar8 << 0x1c | uVar4) >> 0x1a] ^ uVar1;
  uVar1 = uVar1 << 0x1d | uVar1 >> 3;
  uVar3 = (uVar1 >> 1 ^ uVar7) & 0x55555555;
  uVar7 = uVar7 ^ uVar3;
  uVar1 = uVar3 * 2 ^ uVar1;
  uVar3 = (uVar7 >> 8 ^ uVar1) & 0xff00ff;
  uVar1 = uVar1 ^ uVar3;
  uVar7 = uVar3 << 8 ^ uVar7;
  uVar3 = (uVar1 >> 2 ^ uVar7) & 0x33333333;
  uVar7 = uVar7 ^ uVar3;
  uVar1 = uVar3 << 2 ^ uVar1;
  uVar3 = uVar1 & 0xffff ^ uVar7 >> 0x10;
  uVar1 = uVar1 ^ uVar3;
  uVar7 = uVar3 << 0x10 ^ uVar7;
  uVar3 = (uVar1 >> 4 ^ uVar7) & 0xf0f0f0f;
  *data = uVar7 ^ uVar3;
  data[1] = uVar3 << 4 ^ uVar1;
  return;
}

Assistant:

static void DES_encrypt1(uint32_t data[2], const DES_key_schedule *ks,
                         int enc) {
  uint32_t l, r, t, u;

  r = data[0];
  l = data[1];

  IP(r, l);
  // Things have been modified so that the initial rotate is done outside
  // the loop.  This required the DES_SPtrans values in sp.h to be
  // rotated 1 bit to the right. One perl script later and things have a
  // 5% speed up on a sparc2. Thanks to Richard Outerbridge
  // <71755.204@CompuServe.COM> for pointing this out.
  // clear the top bits on machines with 8byte longs
  // shift left by 2
  r = CRYPTO_rotr_u32(r, 29);
  l = CRYPTO_rotr_u32(l, 29);

  // I don't know if it is worth the effort of loop unrolling the
  // inner loop
  if (enc) {
    D_ENCRYPT(ks, l, r, 0);
    D_ENCRYPT(ks, r, l, 1);
    D_ENCRYPT(ks, l, r, 2);
    D_ENCRYPT(ks, r, l, 3);
    D_ENCRYPT(ks, l, r, 4);
    D_ENCRYPT(ks, r, l, 5);
    D_ENCRYPT(ks, l, r, 6);
    D_ENCRYPT(ks, r, l, 7);
    D_ENCRYPT(ks, l, r, 8);
    D_ENCRYPT(ks, r, l, 9);
    D_ENCRYPT(ks, l, r, 10);
    D_ENCRYPT(ks, r, l, 11);
    D_ENCRYPT(ks, l, r, 12);
    D_ENCRYPT(ks, r, l, 13);
    D_ENCRYPT(ks, l, r, 14);
    D_ENCRYPT(ks, r, l, 15);
  } else {
    D_ENCRYPT(ks, l, r, 15);
    D_ENCRYPT(ks, r, l, 14);
    D_ENCRYPT(ks, l, r, 13);
    D_ENCRYPT(ks, r, l, 12);
    D_ENCRYPT(ks, l, r, 11);
    D_ENCRYPT(ks, r, l, 10);
    D_ENCRYPT(ks, l, r, 9);
    D_ENCRYPT(ks, r, l, 8);
    D_ENCRYPT(ks, l, r, 7);
    D_ENCRYPT(ks, r, l, 6);
    D_ENCRYPT(ks, l, r, 5);
    D_ENCRYPT(ks, r, l, 4);
    D_ENCRYPT(ks, l, r, 3);
    D_ENCRYPT(ks, r, l, 2);
    D_ENCRYPT(ks, l, r, 1);
    D_ENCRYPT(ks, r, l, 0);
  }

  // rotate and clear the top bits on machines with 8byte longs
  l = CRYPTO_rotr_u32(l, 3);
  r = CRYPTO_rotr_u32(r, 3);

  FP(r, l);
  data[0] = l;
  data[1] = r;
}